

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::GenUnpackFieldStatement_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field,FieldDef *union_field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  EnumDef *def;
  int iVar4;
  const_iterator cVar5;
  string *psVar6;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  byte bVar12;
  bool bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string out_field;
  string indexing;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  key_type local_e8;
  string local_c8;
  _Alloc_hider local_a8;
  StructDef *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string local_80;
  CppGenerator *local_60;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  BVar3 = (field->value).type.base_type;
  if ((int)BVar3 < 0x10) {
    if (BVar3 == BASE_TYPE_UTYPE) {
      if ((union_field->value).type.base_type != BASE_TYPE_UNION) {
        __assert_fail("union_field->value.type.base_type == BASE_TYPE_UNION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                      ,0xd0a,
                      "std::string flatbuffers::cpp::CppGenerator::GenUnpackFieldStatement(const FieldDef &, const FieldDef *)"
                     );
      }
      std::operator+(&local_108,"_o->",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     union_field);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_108);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8.field_2._8_8_ = plVar7[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      uVar10 = local_108.field_2._M_allocated_capacity;
      _Var11._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00199219;
    }
    if (BVar3 != BASE_TYPE_VECTOR) goto LAB_0019772f;
LAB_00197790:
    local_88 = paVar1;
    Name_abi_cxx11_(&local_e8,this,field);
    if ((field->value).type.element == BASE_TYPE_UTYPE) {
      Name_abi_cxx11_(&local_c8,this,field);
      std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_c8);
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    std::operator+(&local_108,"_o->",&local_e8);
    std::operator+(&local_128,"{ ",&local_108);
    local_60 = this;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
    paVar1 = &local_c8.field_2;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8.field_2._8_8_ = plVar7[3];
      local_c8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_c8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_128.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    def = (field->value).type.enum_def;
    if (def == (EnumDef *)0x0) {
      BVar3 = (field->value).type.element;
      if (3 < BVar3 - BASE_TYPE_UTYPE || BVar3 == BASE_TYPE_BOOL) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_c8._M_string_length = 0;
        local_c8.field_2._M_allocated_capacity =
             (ulong)(uint7)local_c8.field_2._M_allocated_capacity._1_7_ << 8;
        goto LAB_00197e16;
      }
      std::operator+(&local_128,"std::copy(_e->begin(), _e->end(), _o->",&local_e8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_c8.field_2._M_allocated_capacity = *psVar8;
        local_c8.field_2._8_8_ = plVar7[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar8;
        local_c8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_c8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      uVar10 = local_128.field_2._M_allocated_capacity;
      _Var11._M_p = local_128._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) goto LAB_001991e3;
    }
    else {
      local_c8._M_string_length = 0;
      local_c8.field_2._M_allocated_capacity =
           (ulong)(uint7)local_c8.field_2._M_allocated_capacity._1_7_ << 8;
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_38 = paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      BaseGenerator::WrapInNameSpace
                (&local_80,&local_60->super_BaseGenerator,&def->super_Definition,&local_58);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x3627a8);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        aStack_98._M_allocated_capacity = *plVar9;
        aStack_98._8_8_ = plVar7[3];
        local_a8._M_p = (pointer)&aStack_98;
      }
      else {
        aStack_98._M_allocated_capacity = *plVar9;
        local_a8._M_p = (pointer)*plVar7;
      }
      local_a0 = (StructDef *)plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_128.field_2._M_allocated_capacity = *psVar8;
        local_128.field_2._8_8_ = plVar7[3];
        local_128._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar8;
        local_128._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_128._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_128._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p != &aStack_98) {
        operator_delete(local_a8._M_p,(ulong)(aStack_98._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
LAB_00197e16:
      local_38 = &local_c8.field_2;
      std::__cxx11::string::append((char *)&local_c8);
      if ((field->value).type.enum_def != (EnumDef *)0x0) {
        std::__cxx11::string::append((char *)&local_c8);
      }
      if ((field->value).type.element == BASE_TYPE_BOOL) {
        std::__cxx11::string::append((char *)&local_c8);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_128._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"cpp_type","");
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      *)&(field->super_Definition).attributes,&local_128);
      if ((_Rb_tree_header *)cVar5._M_node ==
          &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
        bVar13 = true;
      }
      else {
        bVar13 = *(long *)(cVar5._M_node + 2) == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (bVar13) {
        bVar13 = false;
        if ((((((field->value).type.base_type - BASE_TYPE_VECTOR & 0xfffffffb) == 0) &&
             (bVar13 = false, (field->value).type.element == BASE_TYPE_STRUCT)) &&
            (bVar13 = false, ((field->value).type.struct_def)->fixed == false)) &&
           ((field->native_inline & 1U) == 0)) {
          std::operator+(&local_80,"if(_o->",&local_e8);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            aStack_98._M_allocated_capacity = *plVar9;
            aStack_98._8_8_ = plVar7[3];
            local_a8._M_p = (pointer)&aStack_98;
          }
          else {
            aStack_98._M_allocated_capacity = *plVar9;
            local_a8._M_p = (pointer)*plVar7;
          }
          local_a0 = (StructDef *)plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_128.field_2._M_allocated_capacity = *psVar8;
            local_128.field_2._8_8_ = plVar7[3];
            local_128._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar8;
            local_128._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_128._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_p != &aStack_98) {
            operator_delete(local_a8._M_p,aStack_98._M_allocated_capacity + 1);
          }
          paVar1 = &local_80.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          local_80._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,local_c8._M_dataplus._M_p,
                     local_c8._M_dataplus._M_p + local_c8._M_string_length);
          std::__cxx11::string::append((char *)&local_80);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_80,(ulong)local_e8._M_dataplus._M_p);
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            aStack_98._M_allocated_capacity = *plVar9;
            aStack_98._8_8_ = plVar7[3];
            local_a8._M_p = (pointer)&aStack_98;
          }
          else {
            aStack_98._M_allocated_capacity = *plVar9;
            local_a8._M_p = (pointer)*plVar7;
          }
          local_a0 = (StructDef *)plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_128.field_2._M_allocated_capacity = *psVar8;
            local_128.field_2._8_8_ = plVar7[3];
            local_128._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar8;
            local_128._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_128._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_p != &aStack_98) {
            operator_delete(local_a8._M_p,(ulong)(aStack_98._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          bVar13 = true;
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::operator+(&local_58,"_o->",&local_e8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_58);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_80.field_2._M_allocated_capacity = *psVar8;
          local_80.field_2._8_8_ = plVar7[3];
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar8;
          local_80._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_80._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          aStack_98._M_allocated_capacity = *plVar9;
          aStack_98._8_8_ = plVar7[3];
          local_a8._M_p = (pointer)&aStack_98;
        }
        else {
          aStack_98._M_allocated_capacity = *plVar9;
          local_a8._M_p = (pointer)*plVar7;
        }
        local_a0 = (StructDef *)plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_128.field_2._M_allocated_capacity = *psVar8;
          local_128.field_2._8_8_ = plVar7[3];
          local_128._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar8;
          local_128._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_128._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_p != &aStack_98) {
          operator_delete(local_a8._M_p,aStack_98._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        local_a8._M_p._4_4_ = 0;
        local_a8._M_p._0_4_ = (field->value).type.element;
        local_a0 = (field->value).type.struct_def;
        aStack_98._M_allocated_capacity = (size_type)(field->value).type.enum_def;
        aStack_98._8_2_ = (field->value).type.fixed_length;
        GenUnpackVal(&local_128,local_60,(Type *)&local_a8,&local_c8,true,field);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (bVar13) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else {
        psVar6 = PtrType_abi_cxx11_(local_60,field);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a8,"/*vector resolver, ",psVar6);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_128.field_2._M_allocated_capacity = *psVar8;
          local_128.field_2._8_8_ = plVar7[3];
          local_128._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar8;
          local_128._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_128._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_p != &aStack_98) {
          operator_delete(local_a8._M_p,(ulong)(aStack_98._M_allocated_capacity + 1));
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::operator+(&local_58,"(reinterpret_cast<void **>(&_o->",&local_e8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_58);
        paVar1 = &local_80.field_2;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_80.field_2._M_allocated_capacity = *psVar8;
          local_80.field_2._8_8_ = plVar7[3];
          local_80._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar8;
          local_80._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_80._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          aStack_98._M_allocated_capacity = *plVar9;
          aStack_98._8_8_ = plVar7[3];
          local_a8._M_p = (pointer)&aStack_98;
        }
        else {
          aStack_98._M_allocated_capacity = *plVar9;
          local_a8._M_p = (pointer)*plVar7;
        }
        local_a0 = (StructDef *)plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_128.field_2._M_allocated_capacity = *psVar8;
          local_128.field_2._8_8_ = plVar7[3];
          local_128._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar8;
          local_128._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_128._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_p != &aStack_98) {
          operator_delete(local_a8._M_p,(ulong)(aStack_98._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a8,"static_cast<::flatbuffers::hash_value_t>(",&local_c8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_128.field_2._M_allocated_capacity = *psVar8;
          local_128.field_2._8_8_ = plVar7[3];
          local_128._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar8;
          local_128._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_128._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_p != &aStack_98) {
          operator_delete(local_a8._M_p,(ulong)(aStack_98._M_allocated_capacity + 1));
        }
        psVar6 = PtrType_abi_cxx11_(local_60,field);
        iVar4 = std::__cxx11::string::compare((char *)psVar6);
        if (iVar4 == 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::operator+(&local_58,"_o->",&local_e8);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_58);
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_80.field_2._M_allocated_capacity = *psVar8;
            local_80.field_2._8_8_ = plVar7[3];
            local_80._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_80.field_2._M_allocated_capacity = *psVar8;
            local_80._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_80._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            aStack_98._M_allocated_capacity = *plVar9;
            aStack_98._8_8_ = plVar7[3];
            local_a8._M_p = (pointer)&aStack_98;
          }
          else {
            aStack_98._M_allocated_capacity = *plVar9;
            local_a8._M_p = (pointer)*plVar7;
          }
          local_a0 = (StructDef *)plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_128.field_2._M_allocated_capacity = *psVar8;
            local_128.field_2._8_8_ = plVar7[3];
            local_128._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar8;
            local_128._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_128._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_p != &aStack_98) {
            operator_delete(local_a8._M_p,(ulong)(aStack_98._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                     "; } } else { ",&local_108);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_128.field_2._M_allocated_capacity = *psVar8;
        local_128.field_2._8_8_ = plVar7[3];
        local_128._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar8;
        local_128._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_128._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p != &aStack_98) {
        operator_delete(local_a8._M_p,(ulong)(aStack_98._M_allocated_capacity + 1));
      }
      uVar10 = local_c8.field_2._M_allocated_capacity;
      _Var11._M_p = local_c8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != local_38) {
LAB_001991e3:
        operator_delete(_Var11._M_p,uVar10 + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (BVar3 == BASE_TYPE_UNION) {
      Name_abi_cxx11_(&local_c8,this,field);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x362484);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108.field_2._8_8_ = plVar7[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_108._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_108);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8.field_2._8_8_ = plVar7[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      GenUnionUnpackVal_abi_cxx11_(&local_e8,this,field,"","");
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if (BVar3 == BASE_TYPE_VECTOR64) goto LAB_00197790;
LAB_0019772f:
    paVar2 = &local_e8.field_2;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    local_88 = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"cpp_type","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)&(field->super_Definition).attributes,&local_e8);
    if ((_Rb_tree_header *)cVar5._M_node ==
        &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
      bVar13 = true;
    }
    else {
      bVar13 = *(long *)(cVar5._M_node + 2) == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar13) {
      psVar6 = PtrType_abi_cxx11_(this,field);
      std::operator+(&local_108,"/*scalar resolver, ",psVar6);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_108);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8.field_2._8_8_ = plVar7[3];
        local_e8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      paVar1 = &local_108.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      Name_abi_cxx11_(&local_c8,this,field);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x362540);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108.field_2._8_8_ = plVar7[3];
        local_108._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_108._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_108);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8.field_2._8_8_ = plVar7[3];
        local_e8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      psVar6 = PtrType_abi_cxx11_(this,field);
      iVar4 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar4 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      Name_abi_cxx11_(&local_c8,this,field);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x362484);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108.field_2._8_8_ = plVar7[3];
        local_108._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_108._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_108);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8.field_2._8_8_ = plVar7[3];
        local_e8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar8;
        local_e8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      uVar10 = local_c8.field_2._M_allocated_capacity;
      _Var11._M_p = local_c8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00199219;
    }
    if ((field->value).type.base_type == BASE_TYPE_STRUCT) {
      bVar12 = ((field->value).type.struct_def)->fixed ^ 1;
    }
    else {
      bVar12 = 0;
    }
    Name_abi_cxx11_(&local_108,this,field);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,0x362484);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_e8.field_2._M_allocated_capacity = *psVar8;
      local_e8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar8;
      local_e8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_e8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    paVar1 = &local_108.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (bVar12 != 0) {
      std::operator+(&local_c8,"{ if(",&local_e8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108.field_2._8_8_ = plVar7[3];
        local_108._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_108._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
      local_60 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_c8,"_e->UnPackTo(",&local_e8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108.field_2._8_8_ = plVar7[3];
        local_108._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_108._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      this = local_60;
    }
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,local_e8._M_dataplus._M_p,
               local_e8._M_dataplus._M_p + local_e8._M_string_length);
    std::__cxx11::string::append((char *)&local_108);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"_e","");
    GenUnpackVal(&local_c8,this,&(field->value).type,&local_128,false,field);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_108.field_2._M_allocated_capacity = *psVar8;
      local_108.field_2._8_8_ = plVar7[3];
      local_108._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar8;
      local_108._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_108._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_c8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (bVar12 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                     " } } else if (",&local_e8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_128.field_2._M_allocated_capacity = *psVar8;
        local_128.field_2._8_8_ = plVar7[3];
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar8;
        local_128._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_128._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_128,(ulong)local_e8._M_dataplus._M_p);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_c8.field_2._M_allocated_capacity = *psVar8;
        local_c8.field_2._8_8_ = plVar7[3];
        local_c8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar8;
        local_c8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_c8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108.field_2._8_8_ = plVar7[3];
        local_108._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar8;
        local_108._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_108._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p != &aStack_98) {
        operator_delete(local_a8._M_p,(ulong)(aStack_98._M_allocated_capacity + 1));
      }
    }
  }
  uVar10 = local_e8.field_2._M_allocated_capacity;
  _Var11._M_p = local_e8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
    return __return_storage_ptr__;
  }
LAB_00199219:
  operator_delete(_Var11._M_p,uVar10 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnpackFieldStatement(const FieldDef &field,
                                      const FieldDef *union_field) {
    std::string code;
    switch (field.value.type.base_type) {
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        auto name = Name(field);
        if (field.value.type.element == BASE_TYPE_UTYPE) {
          name = StripUnionType(Name(field));
        }
        const std::string vector_field = "_o->" + name;
        code += "{ " + vector_field + ".resize(_e->size()); ";
        if (!field.value.type.enum_def && !IsBool(field.value.type.element) &&
            IsOneByte(field.value.type.element)) {
          // For vectors of bytes, std::copy is used to improve performance.
          // This doesn't work for:
          //  - enum types because they have to be explicitly static_cast.
          //  - vectors of bool, since they are a template specialization.
          //  - multiple-byte types due to endianness.
          code +=
              "std::copy(_e->begin(), _e->end(), _o->" + name + ".begin()); }";
        } else {
          std::string indexing;
          if (field.value.type.enum_def) {
            indexing += "static_cast<" +
                        WrapInNameSpace(*field.value.type.enum_def) + ">(";
          }
          indexing += "_e->Get(_i)";
          if (field.value.type.enum_def) { indexing += ")"; }
          if (field.value.type.element == BASE_TYPE_BOOL) {
            indexing += " != 0";
          }
          // Generate code that pushes data from _e to _o in the form:
          //   for (uoffset_t i = 0; i < _e->size(); ++i) {
          //     _o->field.push_back(_e->Get(_i));
          //   }
          auto access =
              field.value.type.element == BASE_TYPE_UTYPE
                  ? ".type"
                  : (field.value.type.element == BASE_TYPE_UNION ? ".value"
                                                                 : "");
          if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
            code += "for (::flatbuffers::uoffset64_t _i = 0;";
          } else {
            code += "for (::flatbuffers::uoffset_t _i = 0;";
          }
          code += " _i < _e->size(); _i++) { ";
          auto cpp_type = field.attributes.Lookup("cpp_type");
          if (cpp_type) {
            // Generate code that resolves the cpp pointer type, of the form:
            //  if (resolver)
            //    (*resolver)(&_o->field, (hash_value_t)(_e));
            //  else
            //    _o->field = nullptr;
            code += "/*vector resolver, " + PtrType(&field) + "*/ ";
            code += "if (_resolver) ";
            code += "(*_resolver)";
            code += "(reinterpret_cast<void **>(&_o->" + name + "[_i]" +
                    access + "), ";
            code +=
                "static_cast<::flatbuffers::hash_value_t>(" + indexing + "));";
            if (PtrType(&field) == "naked") {
              code += " else ";
              code += "_o->" + name + "[_i]" + access + " = nullptr";
            } else {
              // code += " else ";
              // code += "_o->" + name + "[_i]" + access + " = " +
              // GenTypeNativePtr(cpp_type->constant, &field, true) + "();";
              code += "/* else do nothing */";
            }
          } else {
            const bool is_pointer = IsVectorOfPointers(field);
            if (is_pointer) {
              code += "if(_o->" + name + "[_i]" + ") { ";
              code += indexing + "->UnPackTo(_o->" + name +
                      "[_i].get(), _resolver);";
              code += " } else { ";
            }
            code += "_o->" + name + "[_i]" + access + " = ";
            code += GenUnpackVal(field.value.type.VectorType(), indexing, true,
                                 field);
            if (is_pointer) { code += "; }"; }
          }
          code += "; } } else { " + vector_field + ".resize(0); }";
        }
        break;
      }
      case BASE_TYPE_UTYPE: {
        FLATBUFFERS_ASSERT(union_field->value.type.base_type ==
                           BASE_TYPE_UNION);
        // Generate code that sets the union type, of the form:
        //   _o->field.type = _e;
        code += "_o->" + union_field->name + ".type = _e;";
        break;
      }
      case BASE_TYPE_UNION: {
        // Generate code that sets the union value, of the form:
        //   _o->field.value = Union::Unpack(_e, field_type(), resolver);
        code += "_o->" + Name(field) + ".value = ";
        code += GenUnionUnpackVal(field, "", "");
        code += ";";
        break;
      }
      default: {
        auto cpp_type = field.attributes.Lookup("cpp_type");
        if (cpp_type) {
          // Generate code that resolves the cpp pointer type, of the form:
          //  if (resolver)
          //    (*resolver)(&_o->field, (hash_value_t)(_e));
          //  else
          //    _o->field = nullptr;
          code += "/*scalar resolver, " + PtrType(&field) + "*/ ";
          code += "if (_resolver) ";
          code += "(*_resolver)";
          code += "(reinterpret_cast<void **>(&_o->" + Name(field) + "), ";
          code += "static_cast<::flatbuffers::hash_value_t>(_e));";
          if (PtrType(&field) == "naked") {
            code += " else ";
            code += "_o->" + Name(field) + " = nullptr;";
          } else {
            // code += " else ";
            // code += "_o->" + Name(field) + " = " +
            // GenTypeNativePtr(cpp_type->constant, &field, true) + "();";
            code += "/* else do nothing */;";
          }
        } else {
          // Generate code for assigning the value, of the form:
          //  _o->field = value;
          const bool is_pointer = IsPointer(field);

          const std::string out_field = "_o->" + Name(field);

          if (is_pointer) {
            code += "{ if(" + out_field + ") { ";
            code += "_e->UnPackTo(" + out_field + ".get(), _resolver);";
            code += " } else { ";
          }
          code += out_field + " = ";
          code += GenUnpackVal(field.value.type, "_e", false, field) + ";";
          if (is_pointer) {
            code += " } } else if (" + out_field + ") { " + out_field +
                    ".reset(); }";
          }
        }
        break;
      }
    }
    return code;
  }